

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O0

Torus * __thiscall SceneParser::parseTorus(SceneParser *this)

{
  int iVar1;
  Torus *this_00;
  float R_00;
  float r_00;
  float r;
  float R;
  char token [100];
  SceneParser *this_local;
  
  unique0x1000024e = this;
  getToken(this,(char *)&r);
  iVar1 = strcmp((char *)&r,"{");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"{\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x155,"Torus *SceneParser::parseTorus()");
  }
  getToken(this,(char *)&r);
  iVar1 = strcmp((char *)&r,"R");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"R\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x157,"Torus *SceneParser::parseTorus()");
  }
  R_00 = readFloat(this);
  getToken(this,(char *)&r);
  iVar1 = strcmp((char *)&r,"r");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"r\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x15a,"Torus *SceneParser::parseTorus()");
  }
  r_00 = readFloat(this);
  getToken(this,(char *)&r);
  iVar1 = strcmp((char *)&r,"}");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"}\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x15d,"Torus *SceneParser::parseTorus()");
  }
  if (this->_current_material != (Material *)0x0) {
    this_00 = (Torus *)operator_new(0x38);
    Torus::Torus(this_00,R_00,r_00,this->_current_material);
    return this_00;
  }
  __assert_fail("_current_material != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                ,0x15e,"Torus *SceneParser::parseTorus()");
}

Assistant:

Torus *
SceneParser::parseTorus() {
    char token[MAX_PARSER_TOKEN_LENGTH];
    getToken(token);
    assert(!strcmp(token, "{"));
    getToken(token);
    assert(!strcmp(token, "R"));
    float R = readFloat();
    getToken(token);
    assert(!strcmp(token, "r"));
    float r = readFloat();
    getToken(token);
    assert(!strcmp(token, "}"));
    assert(_current_material != NULL);
    return new Torus(R, r, _current_material);
}